

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getinfo.c
# Opt level: O1

CURLcode Curl_getinfo(Curl_easy *data,CURLINFO info,...)

{
  double dVar1;
  int iVar2;
  connectdata *pcVar3;
  curl_socket_t cVar4;
  curl_sslbackend cVar5;
  long lVar6;
  curl_slist *pcVar7;
  char *pcVar8;
  char *pcVar9;
  CURLcode CVar10;
  va_list arg;
  double *local_c8;
  
  if (data == (Curl_easy *)0x0) {
    return CURLE_UNKNOWN_OPTION;
  }
  CVar10 = CURLE_UNKNOWN_OPTION;
  switch((info & 0xf00000) - 0x100000 >> 0x14) {
  case CURLINFO_NONE:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    if ((int)info < 0x10001e) {
      if (info == CURLINFO_EFFECTIVE_URL) {
        pcVar8 = (data->change).url;
        pcVar9 = "";
        if (pcVar8 != (char *)0x0) {
          pcVar9 = pcVar8;
        }
        *local_c8 = (double)pcVar9;
        break;
      }
      if (info == CURLINFO_CONTENT_TYPE) {
        pcVar8 = (data->info).contenttype;
      }
      else {
        if (info != CURLINFO_PRIVATE) {
          return CURLE_UNKNOWN_OPTION;
        }
        pcVar8 = (char *)(data->set).private_data;
      }
      goto LAB_0060ea6e;
    }
    switch(info) {
    case CURLINFO_FTP_ENTRY_PATH:
      pcVar8 = (data->state).most_recent_ftp_entrypath;
      break;
    case CURLINFO_REDIRECT_URL:
      pcVar8 = (data->info).wouldredirect;
      break;
    case CURLINFO_PRIMARY_IP:
      pcVar8 = (data->info).conn_primary_ip;
      goto LAB_0060ea39;
    case 0x100021:
    case 0x100022:
    case 0x100023:
    case 0x100025:
    case 0x100026:
    case 0x100027:
    case 0x100028:
      goto switchD_0060e729_default;
    case CURLINFO_RTSP_SESSION_ID:
      pcVar8 = (data->set).str[0x2f];
      break;
    case CURLINFO_LOCAL_IP:
      pcVar8 = (data->info).conn_local_ip;
LAB_0060ea39:
      *local_c8 = (double)pcVar8;
      goto LAB_0060ec84;
    default:
      if (info != CURLINFO_SCHEME) {
        return CURLE_UNKNOWN_OPTION;
      }
      pcVar8 = (data->info).conn_scheme;
    }
LAB_0060ea6e:
    *local_c8 = (double)pcVar8;
    break;
  case 1:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    switch(info) {
    case CURLINFO_RESPONSE_CODE:
      pcVar7 = (curl_slist *)(long)(data->info).httpcode;
      break;
    default:
      goto switchD_0060e729_default;
    case CURLINFO_HEADER_SIZE:
      pcVar7 = (curl_slist *)(data->info).header_size;
      break;
    case CURLINFO_REQUEST_SIZE:
      pcVar7 = (curl_slist *)(data->info).request_size;
      break;
    case CURLINFO_SSL_VERIFYRESULT:
      pcVar7 = (curl_slist *)(data->set).ssl.certverifyresult;
      break;
    case CURLINFO_FILETIME:
      pcVar7 = (curl_slist *)(data->info).filetime;
      break;
    case CURLINFO_REDIRECT_COUNT:
      pcVar7 = (curl_slist *)(data->set).followlocation;
      break;
    case CURLINFO_HTTP_CONNECTCODE:
      pcVar7 = (curl_slist *)(long)(data->info).httpproxycode;
      break;
    case CURLINFO_HTTPAUTH_AVAIL:
      pcVar7 = (curl_slist *)(data->info).httpauthavail;
      break;
    case CURLINFO_PROXYAUTH_AVAIL:
      pcVar7 = (curl_slist *)(data->info).proxyauthavail;
      break;
    case CURLINFO_OS_ERRNO:
      pcVar7 = (curl_slist *)(long)(data->state).os_errno;
      break;
    case CURLINFO_NUM_CONNECTS:
      pcVar7 = (curl_slist *)(data->info).numconnects;
      break;
    case CURLINFO_LASTSOCKET:
      cVar4 = Curl_getconnectinfo(data,(connectdata **)0x0);
      if (cVar4 != -1) {
        *local_c8 = (double)(long)cVar4;
        return CURLE_OK;
      }
      *local_c8 = -NAN;
      return CURLE_OK;
    case CURLINFO_CONDITION_UNMET:
      pcVar7 = (curl_slist *)(ulong)(data->info).timecond;
      break;
    case CURLINFO_RTSP_CLIENT_CSEQ:
      pcVar7 = (curl_slist *)(data->state).rtsp_next_client_CSeq;
      break;
    case CURLINFO_RTSP_SERVER_CSEQ:
      pcVar7 = (curl_slist *)(data->state).rtsp_next_server_CSeq;
      break;
    case CURLINFO_RTSP_CSEQ_RECV:
      pcVar7 = (curl_slist *)(data->state).rtsp_CSeq_recv;
      break;
    case CURLINFO_PRIMARY_PORT:
      pcVar7 = (curl_slist *)(data->info).conn_primary_port;
      break;
    case CURLINFO_LOCAL_PORT:
      pcVar7 = (curl_slist *)(data->info).conn_local_port;
      break;
    case CURLINFO_HTTP_VERSION:
      iVar2 = (data->info).httpversion;
      if (iVar2 == 0x14) {
        *local_c8 = 1.48219693752374e-323;
      }
      else if (iVar2 == 0xb) {
        *local_c8 = 9.88131291682493e-324;
      }
      else if (iVar2 == 10) {
        *local_c8 = 4.94065645841247e-324;
      }
      else {
        *local_c8 = 0.0;
      }
      goto LAB_0060ec84;
    case CURLINFO_PROXY_SSL_VERIFYRESULT:
      pcVar7 = (curl_slist *)(data->set).proxy_ssl.certverifyresult;
      break;
    case CURLINFO_PROTOCOL:
      pcVar7 = (curl_slist *)(ulong)(data->info).conn_protocol;
    }
LAB_0060ec6e:
    *local_c8 = (double)pcVar7;
    break;
  case 2:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    switch(info) {
    case CURLINFO_TOTAL_TIME:
      dVar1 = (data->progress).timespent;
      break;
    case CURLINFO_NAMELOOKUP_TIME:
      dVar1 = (data->progress).t_nslookup;
      break;
    case CURLINFO_CONNECT_TIME:
      dVar1 = (data->progress).t_connect;
      break;
    case CURLINFO_PRETRANSFER_TIME:
      dVar1 = (data->progress).t_pretransfer;
      break;
    case CURLINFO_SIZE_UPLOAD:
      dVar1 = (double)(data->progress).uploaded;
      break;
    case CURLINFO_SIZE_DOWNLOAD:
      dVar1 = (double)(data->progress).downloaded;
      break;
    case CURLINFO_SPEED_DOWNLOAD:
      dVar1 = (double)(data->progress).dlspeed;
      break;
    case CURLINFO_SPEED_UPLOAD:
      dVar1 = (double)(data->progress).ulspeed;
      break;
    default:
      goto switchD_0060e729_default;
    case CURLINFO_CONTENT_LENGTH_DOWNLOAD:
      if (((data->progress).flags & 0x40) == 0) {
LAB_0060eb5f:
        dVar1 = -1.0;
      }
      else {
        dVar1 = (double)(data->progress).size_dl;
      }
      break;
    case CURLINFO_CONTENT_LENGTH_UPLOAD:
      if (((data->progress).flags & 0x20) == 0) goto LAB_0060eb5f;
      dVar1 = (double)(data->progress).size_ul;
      break;
    case CURLINFO_STARTTRANSFER_TIME:
      dVar1 = (data->progress).t_starttransfer;
      break;
    case CURLINFO_REDIRECT_TIME:
      dVar1 = (data->progress).t_redirect;
      break;
    case CURLINFO_APPCONNECT_TIME:
      dVar1 = (data->progress).t_appconnect;
    }
    *local_c8 = dVar1;
    break;
  case 3:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    if ((int)info < 0x400022) {
      if (info == CURLINFO_SSL_ENGINES) {
        pcVar7 = Curl_ssl_engines_list(data);
      }
      else {
        if (info != CURLINFO_COOKIELIST) {
          return CURLE_UNKNOWN_OPTION;
        }
        pcVar7 = Curl_cookie_list(data);
      }
      goto LAB_0060ec6e;
    }
    if (info == CURLINFO_CERTINFO) {
      *local_c8 = (double)&(data->info).certs;
    }
    else {
      if ((info != CURLINFO_TLS_SESSION) && (info != CURLINFO_TLS_SSL_PTR)) {
        return CURLE_UNKNOWN_OPTION;
      }
      pcVar3 = data->easy_conn;
      *local_c8 = (double)&data->tsi;
      cVar5 = Curl_ssl_backend();
      (data->tsi).backend = cVar5;
      (data->tsi).internals = (void *)0x0;
      if (cVar5 == CURLSSLBACKEND_NONE || pcVar3 == (connectdata *)0x0) {
        return CURLE_OK;
      }
      lVar6 = 0;
      while ((&pcVar3->ssl[0].use)[lVar6] != true) {
        lVar6 = lVar6 + 0x28;
        if (lVar6 != 0x28) {
          return CURLE_OK;
        }
      }
      (data->tsi).internals =
           *(void **)((long)&pcVar3->ssl[0].ctx + lVar6 + (ulong)(info != CURLINFO_TLS_SESSION) * 8)
      ;
    }
    break;
  case 4:
    if ((info == CURLINFO_ACTIVESOCKET) && (local_c8 != (double *)0x0)) {
      CVar10 = CURLE_OK;
      cVar4 = Curl_getconnectinfo(data,(connectdata **)0x0);
      *(curl_socket_t *)local_c8 = cVar4;
    }
  default:
    goto switchD_0060e729_default;
  }
LAB_0060ec84:
  CVar10 = CURLE_OK;
switchD_0060e729_default:
  return CVar10;
}

Assistant:

CURLcode Curl_getinfo(struct Curl_easy *data, CURLINFO info, ...)
{
  va_list arg;
  long *param_longp = NULL;
  double *param_doublep = NULL;
  const char **param_charp = NULL;
  struct curl_slist **param_slistp = NULL;
  curl_socket_t *param_socketp = NULL;
  int type;
  CURLcode result = CURLE_UNKNOWN_OPTION;

  if(!data)
    return result;

  va_start(arg, info);

  type = CURLINFO_TYPEMASK & (int)info;
  switch(type) {
  case CURLINFO_STRING:
    param_charp = va_arg(arg, const char **);
    if(param_charp)
      result = getinfo_char(data, info, param_charp);
    break;
  case CURLINFO_LONG:
    param_longp = va_arg(arg, long *);
    if(param_longp)
      result = getinfo_long(data, info, param_longp);
    break;
  case CURLINFO_DOUBLE:
    param_doublep = va_arg(arg, double *);
    if(param_doublep)
      result = getinfo_double(data, info, param_doublep);
    break;
  case CURLINFO_SLIST:
    param_slistp = va_arg(arg, struct curl_slist **);
    if(param_slistp)
      result = getinfo_slist(data, info, param_slistp);
    break;
  case CURLINFO_SOCKET:
    param_socketp = va_arg(arg, curl_socket_t *);
    if(param_socketp)
      result = getinfo_socket(data, info, param_socketp);
    break;
  default:
    break;
  }

  va_end(arg);

  return result;
}